

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_InitUndeclConstProperty<Js::OpLayoutT_ElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  PropertyId propertyId_00;
  Var obj;
  JavascriptLibrary *this_00;
  Var newValue;
  PropertyId propertyId;
  Var instance;
  OpLayoutT_ElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  obj = InnerScopeFromIndex(this,(uint)playout->scopeIndex);
  propertyId_00 = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  this_00 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
  newValue = JavascriptLibrary::GetUndeclBlockVar(this_00);
  Js::JavascriptOperators::OP_InitConstProperty(obj,propertyId_00,newValue);
  return;
}

Assistant:

void InterpreterStackFrame::OP_InitUndeclConstProperty(unaligned T* playout)
    {
        Var instance = InnerScopeFromIndex(playout->scopeIndex);
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        JavascriptOperators::OP_InitConstProperty(instance, propertyId, this->scriptContext->GetLibrary()->GetUndeclBlockVar());
    }